

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcapng.c
# Opt level: O0

PCAPNG_RESULT pcapng_append_interface_option(PCAPNG_HANDLE *handle,option_header *interface_option)

{
  size_t __n;
  uint8_t *dest;
  size_t copysz;
  PCAPNG_RESULT retval;
  option_header *interface_option_local;
  PCAPNG_HANDLE *handle_local;
  
  copysz._4_4_ = PCAPNG_OK;
  if ((handle == (PCAPNG_HANDLE *)0x0) || (handle->fd == -1)) {
    copysz._4_4_ = PCAPNG_INVALID_HANDLE;
  }
  else if ((((handle->interface_description == (interface_description_block *)0x0) ||
            (handle->interface_description == (interface_description_block *)0xffffffffffffffff)) ||
           (handle->next_interface_option_offset == 0)) ||
          (interface_option == (option_header *)0x0)) {
    copysz._4_4_ = PCAPNG_NO_MEMORY;
  }
  else {
    __n = (size_t)(int)(interface_option->option_length + 4);
    memcpy((void *)((long)&handle->interface_description->block_type +
                   handle->next_interface_option_offset),interface_option,__n);
    handle->next_interface_option_offset =
         (__n + 3 & 0xfffffffffffffffc) + handle->next_interface_option_offset;
    padopt.option_length =
         ((short)handle->interface_description_size - (short)handle->next_interface_option_offset) -
         0xc;
    *(option_header *)
     ((long)&handle->interface_description->block_type + handle->next_interface_option_offset) =
         padopt;
  }
  return copysz._4_4_;
}

Assistant:

PCAPNG_RESULT pcapng_append_interface_option( PCAPNG_HANDLE * handle,
					      const option_header * interface_option )
{
	PCAPNG_RESULT retval = PCAPNG_OK;
	if (handle && (handle->fd != -1)) {
		if (handle->interface_description &&
		    (handle->interface_description != MAP_FAILED) &&
		    handle->next_interface_option_offset &&
		    interface_option) {
			size_t copysz = 4+interface_option->option_length;
			uint8_t * dest = &((uint8_t *)handle->interface_description)[handle->next_interface_option_offset];
			(void) memcpy( dest, interface_option, copysz );
			handle->next_interface_option_offset += 4*((copysz+3)/4);

			/* update padding option */
			dest = &((uint8_t *)handle->interface_description)[handle->next_interface_option_offset];
			padopt.option_length = handle->interface_description_size -
				handle->next_interface_option_offset - 12;
			(void) memcpy( dest, &padopt, sizeof( padopt ) );
		}
		else {
			retval = PCAPNG_NO_MEMORY;
		}
	}
	else {
		retval = PCAPNG_INVALID_HANDLE;
	}
	return retval;
}